

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-batchverify.h
# Opt level: O1

int ed25519_sign_open_batch(uchar **m,size_t *mlen,uchar **pk,uchar **RS,size_t num,int *valid)

{
  uchar **ppuVar1;
  bignum256modm_element_t bVar2;
  heap_index_t hVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  char *pcVar7;
  bignum256modm *pabVar8;
  heap_index_t hVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bignum256modm *pabVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  bignum256modm *y;
  ulong uVar21;
  size_t sVar22;
  long lVar23;
  batch_heap *buf;
  heap_index_t hVar24;
  size_t sVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ge25519 *pgVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uchar point_buffer [3] [32];
  ge25519 p;
  uchar hram [64];
  batch_heap batch;
  uint local_72bc;
  uchar **local_72b0;
  long local_7258;
  long local_7250;
  long local_7248;
  long local_7240;
  char local_7238 [8];
  char acStack_7230 [8];
  char local_7228 [4];
  char cStack_7224;
  char cStack_7223;
  char cStack_7222;
  uchar uStack_7221;
  char cStack_7220;
  char cStack_721f;
  char cStack_721e;
  char cStack_721d;
  char cStack_721c;
  char cStack_721b;
  char cStack_721a;
  uchar uStack_7219;
  char local_7218 [8];
  char acStack_7210 [8];
  char local_7208 [4];
  char cStack_7204;
  char cStack_7203;
  char cStack_7202;
  uchar uStack_7201;
  char cStack_7200;
  char cStack_71ff;
  char cStack_71fe;
  char cStack_71fd;
  char cStack_71fc;
  char cStack_71fb;
  char cStack_71fa;
  uchar uStack_71f9;
  ge25519 local_71f8;
  uchar local_7158 [64];
  batch_heap local_7118;
  
  if (num != 0) {
    sVar5 = 0;
    do {
      valid[sVar5] = 1;
      sVar5 = sVar5 + 1;
    } while (num != sVar5);
  }
  local_72b0 = RS;
  if (num < 4) {
    local_72bc = 0;
LAB_00223210:
    if (num != 0) {
      sVar5 = 0;
      do {
        iVar4 = ed25519_sign_open(m[sVar5],mlen[sVar5],pk[sVar5],local_72b0[sVar5]);
        valid[sVar5] = (uint)(iVar4 == 0);
        local_72bc = local_72bc | iVar4 == 0 ^ 1;
        sVar5 = sVar5 + 1;
      } while (num != sVar5);
    }
    return local_72bc;
  }
  local_72bc = 0;
LAB_00222349:
  buf = &local_7118;
  uVar26 = 0x40;
  if (num < 0x40) {
    uVar26 = num;
  }
  RAND_bytes((uchar *)buf,(int)uVar26 << 4);
  lVar11 = uVar26 + (uVar26 == 0);
  pabVar16 = local_7118.scalars;
  y = local_7118.scalars + uVar26 + 1;
  pabVar8 = y;
  lVar27 = lVar11;
  do {
    expand256_modm(*pabVar8,(uchar *)buf,0x10);
    buf = (batch_heap *)(buf->r + 1);
    pabVar8 = pabVar8 + 1;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  lVar27 = 0;
  pabVar8 = pabVar16;
  do {
    expand256_modm(*pabVar8,local_72b0[lVar27] + 0x20,0x20);
    mul256_modm(*pabVar8,*pabVar8,*y);
    lVar27 = lVar27 + 1;
    y = y + 1;
    pabVar8 = pabVar8 + 1;
  } while (lVar11 != lVar27);
  if (1 < num) {
    lVar27 = uVar26 - 1;
    pabVar8 = local_7118.scalars;
    do {
      pabVar8 = pabVar8 + 1;
      add256_modm(*pabVar16,*pabVar16,*pabVar8);
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
  }
  pabVar16 = local_7118.scalars;
  lVar27 = 0;
  do {
    pabVar16 = pabVar16 + 1;
    ed25519_hram(local_7158,local_72b0[lVar27],pk[lVar27],m[lVar27],mlen[lVar27]);
    lVar27 = lVar27 + 1;
    expand256_modm(*pabVar16,local_7158,0x40);
    mul256_modm(*pabVar16,*pabVar16,pabVar16[uVar26]);
  } while (lVar11 != lVar27);
  memcpy(local_7118.points,&ge25519_basepoint,0xa0);
  pgVar29 = local_7118.points;
  uVar28 = 0;
  do {
    pgVar29 = pgVar29 + 1;
    if (uVar26 == uVar28) {
      pgVar29 = local_7118.points + uVar26 + 1;
      lVar27 = 0;
      goto LAB_00222544;
    }
    ppuVar1 = pk + uVar28;
    uVar28 = uVar28 + 1;
    iVar4 = ge25519_unpack_negative_vartime(pgVar29,*ppuVar1);
  } while (iVar4 != 0);
  goto LAB_0022316e;
  while( true ) {
    lVar27 = lVar27 + 1;
    pgVar29 = pgVar29 + 1;
    if (lVar11 == lVar27) break;
LAB_00222544:
    iVar4 = ge25519_unpack_negative_vartime(pgVar29,local_72b0[lVar27]);
    if (iVar4 == 0) goto LAB_0022316e;
  }
  local_7118.heap[0] = 0;
  local_7118.size = 0;
  do {
    heap_insert_next(&local_7118);
  } while (local_7118.size < (uVar26 + 1 | 1));
  bVar32 = false;
  sVar5 = 4;
LAB_002225bf:
  hVar9 = local_7118.heap[2];
  hVar3 = local_7118.heap[1];
  hVar24 = local_7118.heap[0];
  iVar4 = lt256_modm_batch(local_7118.scalars[local_7118.heap[1]],
                           local_7118.scalars[local_7118.heap[2]],sVar5);
  if (iVar4 == 0) {
    hVar9 = hVar3;
  }
  lVar27 = 0;
  do {
    bVar2 = local_7118.scalars[hVar9][lVar27];
    if (bVar2 != 0) break;
    bVar31 = lVar27 != 4;
    lVar27 = lVar27 + 1;
  } while (bVar31);
  if (bVar2 != 0) {
    sVar5 = sVar5 - (local_7118.scalars[hVar24][sVar5] == 0);
    if (bVar32) {
LAB_00222661:
      bVar32 = true;
    }
    else {
      bVar32 = false;
      if ((local_7118.scalars[hVar24][2] & 0xffffffffff0000) == 0 &&
          (local_7118.scalars[hVar24][3] == 0 && local_7118.scalars[hVar24][4] == 0)) {
        hVar24 = local_7118.heap[0];
        hVar3 = local_7118.heap[1];
        hVar9 = local_7118.heap[2];
        while (local_7118.heap[0] = hVar24, local_7118.heap[1] = hVar3, local_7118.heap[2] = hVar9,
              local_7118.size <= uVar26 * 2) {
          heap_insert_next(&local_7118);
          hVar24 = local_7118.heap[0];
          hVar3 = local_7118.heap[1];
          hVar9 = local_7118.heap[2];
        }
        iVar4 = lt256_modm_batch(local_7118.scalars[hVar3],local_7118.scalars[hVar9],sVar5);
        if (iVar4 == 0) {
          hVar9 = hVar3;
        }
        goto LAB_00222661;
      }
    }
    pabVar16 = local_7118.scalars + hVar24;
    pabVar8 = local_7118.scalars + hVar9;
    iVar14 = 0;
    lVar23 = 0;
    iVar15 = 0;
    lVar19 = 0;
    iVar4 = 0;
    lVar27 = 0;
    switch(sVar5) {
    case 4:
      uVar28 = (*pabVar16)[0] - (*pabVar8)[0];
      lVar23 = (long)uVar28 >> 0x3f;
      (*pabVar16)[0] = uVar28 & 0xffffffffffffff;
      iVar14 = 1;
    case 3:
      uVar28 = (ulong)(uint)(iVar14 * 8);
      uVar21 = (*(long *)((long)*pabVar16 + uVar28) - *(long *)((long)*pabVar8 + uVar28)) + lVar23;
      lVar19 = (long)uVar21 >> 0x3f;
      *(ulong *)((long)*pabVar16 + uVar28) = uVar21 & 0xffffffffffffff;
      iVar15 = iVar14 + 1;
    case 2:
      uVar28 = (ulong)(uint)(iVar15 * 8);
      uVar21 = (*(long *)((long)*pabVar16 + uVar28) - *(long *)((long)*pabVar8 + uVar28)) + lVar19;
      lVar27 = (long)uVar21 >> 0x3f;
      *(ulong *)((long)*pabVar16 + uVar28) = uVar21 & 0xffffffffffffff;
      iVar4 = iVar15 + 1;
    case 1:
      uVar28 = (ulong)(uint)(iVar4 * 8);
      uVar21 = (*(long *)((long)*pabVar16 + uVar28) - *(long *)((long)*pabVar8 + uVar28)) + lVar27;
      lVar27 = (long)uVar21 >> 0x3f;
      *(ulong *)((long)*pabVar16 + uVar28) = uVar21 & 0xffffffffffffff;
      iVar4 = iVar4 + 1;
      break;
    default:
      iVar4 = 0;
      lVar27 = 0;
    }
    uVar28 = (ulong)(uint)(iVar4 << 3);
    *(long *)((long)*pabVar16 + uVar28) =
         (lVar27 + *(long *)((long)*pabVar16 + uVar28)) - *(long *)((long)*pabVar8 + uVar28);
    ge25519_add(local_7118.points + hVar9,local_7118.points + hVar9,local_7118.points + hVar24);
    uVar28 = 1;
    if (2 < local_7118.size) {
      uVar21 = 2;
      uVar10 = 1;
      uVar12 = 0;
      do {
        iVar4 = lt256_modm_batch(local_7118.scalars[local_7118.heap[uVar10]],
                                 local_7118.scalars[local_7118.heap[uVar21]],sVar5);
        uVar28 = uVar10;
        if (iVar4 != 0) {
          uVar28 = uVar21;
        }
        hVar24 = local_7118.heap[uVar12];
        local_7118.heap[uVar12] = local_7118.heap[uVar28];
        local_7118.heap[uVar28] = hVar24;
        uVar21 = uVar28 * 2 + 2;
        uVar10 = uVar28 * 2 + 1;
        uVar12 = uVar28;
      } while (uVar21 < local_7118.size);
    }
    if (uVar28 != 0) {
      do {
        uVar21 = uVar28 - 1;
        uVar10 = uVar21 >> 1;
        hVar24 = local_7118.heap[uVar10];
        if (sVar5 < 5) {
          pabVar16 = local_7118.scalars + hVar24;
          pabVar8 = local_7118.scalars + local_7118.heap[uVar28];
          lVar20 = 0;
          lVar23 = 0;
          lVar19 = 0;
          lVar27 = 0;
          lVar30 = 0;
          sVar22 = sVar5;
          sVar25 = sVar5;
          switch(sVar5) {
          case 4:
            lVar23 = (long)((*pabVar8)[0] - (*pabVar16)[0]) >> 0x3f;
            lVar20 = 1;
          case 3:
            uVar12 = (ulong)(uint)((int)lVar20 * 8);
            lVar19 = (lVar23 + *(long *)((long)*pabVar8 + uVar12)) -
                     *(long *)((long)*pabVar16 + uVar12) >> 0x3f;
            lVar20 = lVar20 + 1;
          case 2:
            uVar12 = (ulong)(uint)((int)lVar20 * 8);
            lVar30 = (lVar19 + *(long *)((long)*pabVar8 + uVar12)) -
                     *(long *)((long)*pabVar16 + uVar12) >> 0x3f;
            lVar27 = lVar20 + 1;
          case 1:
            uVar12 = (ulong)(uint)((int)lVar27 * 8);
            sVar25 = (lVar30 + *(long *)((long)*pabVar8 + uVar12)) -
                     *(long *)((long)*pabVar16 + uVar12) >> 0x3f;
            sVar22 = lVar27 + 1;
          }
          if ((long)((sVar25 + (*pabVar8)[sVar22]) - (*pabVar16)[sVar22]) < 0) break;
        }
        local_7118.heap[uVar10] = local_7118.heap[uVar28];
        local_7118.heap[uVar28] = hVar24;
        uVar28 = uVar10;
      } while (1 < uVar21);
    }
    goto LAB_002225bf;
  }
  lVar27 = 0;
  do {
    uVar28 = local_7118.scalars[hVar24][lVar27];
    bVar32 = lVar27 == 0;
    if (uVar28 != bVar32) break;
    bVar31 = lVar27 != 4;
    lVar27 = lVar27 + 1;
  } while (bVar31);
  pgVar29 = local_7118.points + hVar24;
  if (uVar28 == bVar32) {
    memcpy(&local_71f8,pgVar29,0xa0);
  }
  else {
    lVar27 = 0;
    do {
      bVar2 = local_7118.scalars[hVar24][lVar27];
      if (bVar2 != 0) break;
      bVar32 = lVar27 != 4;
      lVar27 = lVar27 + 1;
    } while (bVar32);
    if (bVar2 == 0) {
      memset(&local_71f8,0,0xa0);
      local_71f8.y[0] = 1;
      local_71f8.z[0] = 1;
    }
    else {
      memcpy(&local_71f8,pgVar29,0xa0);
      lVar27 = 0xb19;
      do {
        lVar23 = lVar27;
        uVar28 = *(ulong *)((long)local_7118.r + lVar23 * 8 + hVar24 * 0x28);
        lVar27 = lVar23 + -1;
      } while (uVar28 == 0);
      lVar23 = lVar23 + -0xb16;
      uVar21 = 0x80000000000000;
      do {
        uVar10 = uVar21;
        uVar21 = uVar10 >> 1;
      } while ((uVar10 & uVar28) == 0);
      do {
        uVar28 = local_7118.scalars[hVar24][lVar23];
        do {
          ge25519_double(&local_71f8,&local_71f8);
          if ((uVar28 & uVar10) != 0) {
            ge25519_add(&local_71f8,&local_71f8,pgVar29);
          }
          bVar32 = 1 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar32);
        uVar10 = 0x80000000000000;
        bVar32 = lVar23 != 0;
        lVar23 = lVar23 + -1;
      } while (bVar32);
    }
  }
  uVar28 = (local_71f8.x[0] >> 0x33) + local_71f8.x[1];
  uVar21 = (uVar28 >> 0x33) + local_71f8.x[2];
  uVar10 = (uVar21 >> 0x33) + local_71f8.x[3];
  uVar12 = (uVar10 >> 0x33) + local_71f8.x[4];
  uVar13 = (uVar12 >> 0x33) * 0x13 + (local_71f8.x[0] & 0x7ffffffffffff);
  uVar17 = (uVar13 >> 0x33) + (uVar28 & 0x7ffffffffffff);
  uVar28 = (uVar17 >> 0x33) + (uVar21 & 0x7ffffffffffff);
  uVar18 = (uVar28 >> 0x33) + (uVar10 & 0x7ffffffffffff);
  uVar10 = (uVar18 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar13 & 0x7ffffffffffff) + (uVar10 >> 0x33) * 0x13 + 0x13;
  uVar21 = (uVar12 >> 0x33) + (uVar17 & 0x7ffffffffffff);
  uVar13 = (uVar21 >> 0x33) + (uVar28 & 0x7ffffffffffff);
  uVar17 = (uVar13 >> 0x33) + (uVar18 & 0x7ffffffffffff);
  uVar28 = (uVar17 >> 0x33) + (uVar10 & 0x7ffffffffffff);
  uVar18 = (uVar12 & 0x7ffffffffffff) + (uVar28 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar10 = (uVar18 >> 0x33) + (uVar21 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar12 = (uVar10 >> 0x33) + (uVar13 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar21 = (uVar12 >> 0x33) + (uVar17 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar13 = uVar10 << 0x33 | uVar18 & 0x7ffffffffffff;
  lVar27 = 0;
  do {
    *(char *)((long)&local_7258 + lVar27) = (char)uVar13;
    lVar27 = lVar27 + 1;
    uVar13 = uVar13 >> 8;
  } while (lVar27 != 8);
  uVar10 = uVar12 << 0x26 | uVar10 >> 0xd & 0x3fffffffff;
  lVar27 = 8;
  do {
    *(char *)((long)&local_7258 + lVar27) = (char)uVar10;
    lVar27 = lVar27 + 1;
    uVar10 = uVar10 >> 8;
  } while (lVar27 != 0x10);
  plVar6 = &local_7248;
  uVar10 = uVar21 * 0x2000000 | (ulong)((uint)(uVar12 >> 0x1a) & 0x1ffffff);
  lVar27 = 8;
  do {
    *(char *)plVar6 = (char)uVar10;
    plVar6 = (long *)((long)plVar6 + 1);
    uVar10 = uVar10 >> 8;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  uVar28 = (uVar28 + 0x7ffffffffffff + (uVar21 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar21 >> 0x27) & 0xfff);
  lVar27 = 8;
  do {
    *(char *)plVar6 = (char)uVar28;
    plVar6 = (long *)((long)plVar6 + 1);
    uVar28 = uVar28 >> 8;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  uVar28 = (local_71f8.y[0] >> 0x33) + local_71f8.y[1];
  uVar21 = (uVar28 >> 0x33) + local_71f8.y[2];
  uVar10 = (uVar21 >> 0x33) + local_71f8.y[3];
  uVar12 = (uVar10 >> 0x33) + local_71f8.y[4];
  uVar13 = (uVar12 >> 0x33) * 0x13 + (local_71f8.y[0] & 0x7ffffffffffff);
  uVar17 = (uVar13 >> 0x33) + (uVar28 & 0x7ffffffffffff);
  uVar28 = (uVar17 >> 0x33) + (uVar21 & 0x7ffffffffffff);
  uVar18 = (uVar28 >> 0x33) + (uVar10 & 0x7ffffffffffff);
  uVar10 = (uVar18 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar13 & 0x7ffffffffffff) + (uVar10 >> 0x33) * 0x13 + 0x13;
  uVar21 = (uVar12 >> 0x33) + (uVar17 & 0x7ffffffffffff);
  uVar13 = (uVar21 >> 0x33) + (uVar28 & 0x7ffffffffffff);
  uVar17 = (uVar13 >> 0x33) + (uVar18 & 0x7ffffffffffff);
  uVar28 = (uVar17 >> 0x33) + (uVar10 & 0x7ffffffffffff);
  uVar18 = (uVar12 & 0x7ffffffffffff) + (uVar28 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar10 = (uVar18 >> 0x33) + (uVar21 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar12 = (uVar10 >> 0x33) + (uVar13 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar21 = (uVar12 >> 0x33) + (uVar17 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar13 = uVar10 << 0x33 | uVar18 & 0x7ffffffffffff;
  lVar27 = 0x20;
  do {
    *(char *)((long)&local_7258 + lVar27) = (char)uVar13;
    lVar27 = lVar27 + 1;
    uVar13 = uVar13 >> 8;
  } while (lVar27 != 0x28);
  uVar10 = uVar12 << 0x26 | uVar10 >> 0xd & 0x3fffffffff;
  lVar27 = 0x28;
  do {
    *(char *)((long)&local_7258 + lVar27) = (char)uVar10;
    lVar27 = lVar27 + 1;
    uVar10 = uVar10 >> 8;
  } while (lVar27 != 0x30);
  pcVar7 = local_7228;
  uVar10 = uVar21 * 0x2000000 | (ulong)((uint)(uVar12 >> 0x1a) & 0x1ffffff);
  lVar27 = 8;
  do {
    *pcVar7 = (char)uVar10;
    pcVar7 = pcVar7 + 1;
    uVar10 = uVar10 >> 8;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  uVar28 = (uVar28 + 0x7ffffffffffff + (uVar21 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar21 >> 0x27) & 0xfff);
  lVar27 = 8;
  do {
    *pcVar7 = (char)uVar28;
    pcVar7 = pcVar7 + 1;
    uVar28 = uVar28 >> 8;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  uVar28 = (local_71f8.z[0] >> 0x33) + local_71f8.z[1];
  uVar21 = (uVar28 >> 0x33) + local_71f8.z[2];
  uVar10 = (uVar21 >> 0x33) + local_71f8.z[3];
  uVar12 = (uVar10 >> 0x33) + local_71f8.z[4];
  uVar13 = (uVar12 >> 0x33) * 0x13 + (local_71f8.z[0] & 0x7ffffffffffff);
  uVar17 = (uVar13 >> 0x33) + (uVar28 & 0x7ffffffffffff);
  uVar28 = (uVar17 >> 0x33) + (uVar21 & 0x7ffffffffffff);
  uVar18 = (uVar28 >> 0x33) + (uVar10 & 0x7ffffffffffff);
  uVar10 = (uVar18 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar13 & 0x7ffffffffffff) + (uVar10 >> 0x33) * 0x13 + 0x13;
  uVar21 = (uVar12 >> 0x33) + (uVar17 & 0x7ffffffffffff);
  uVar13 = (uVar21 >> 0x33) + (uVar28 & 0x7ffffffffffff);
  uVar17 = (uVar13 >> 0x33) + (uVar18 & 0x7ffffffffffff);
  uVar28 = (uVar17 >> 0x33) + (uVar10 & 0x7ffffffffffff);
  uVar18 = (uVar12 & 0x7ffffffffffff) + (uVar28 >> 0x33) * 0x13 + 0x7ffffffffffed;
  uVar10 = (uVar18 >> 0x33) + (uVar21 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar12 = (uVar10 >> 0x33) + (uVar13 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar21 = (uVar12 >> 0x33) + (uVar17 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar13 = uVar10 << 0x33 | uVar18 & 0x7ffffffffffff;
  lVar27 = 0x40;
  do {
    *(char *)((long)&local_7258 + lVar27) = (char)uVar13;
    lVar27 = lVar27 + 1;
    uVar13 = uVar13 >> 8;
  } while (lVar27 != 0x48);
  uVar10 = uVar12 << 0x26 | uVar10 >> 0xd & 0x3fffffffff;
  lVar27 = 0x48;
  do {
    *(char *)((long)&local_7258 + lVar27) = (char)uVar10;
    lVar27 = lVar27 + 1;
    uVar10 = uVar10 >> 8;
  } while (lVar27 != 0x50);
  pcVar7 = local_7208;
  uVar10 = uVar21 * 0x2000000 | (ulong)((uint)(uVar12 >> 0x1a) & 0x1ffffff);
  lVar27 = 8;
  do {
    *pcVar7 = (char)uVar10;
    pcVar7 = pcVar7 + 1;
    uVar10 = uVar10 >> 8;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  uVar28 = (uVar28 + 0x7ffffffffffff + (uVar21 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar21 >> 0x27) & 0xfff);
  lVar27 = 8;
  do {
    *pcVar7 = (char)uVar28;
    pcVar7 = pcVar7 + 1;
    uVar28 = uVar28 >> 8;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  batch_point_buffer[1][1] = local_7238[1];
  batch_point_buffer[1][0] = local_7238[0];
  batch_point_buffer[1][2] = local_7238[2];
  batch_point_buffer[1][3] = local_7238[3];
  batch_point_buffer[1][4] = local_7238[4];
  batch_point_buffer[1][5] = local_7238[5];
  batch_point_buffer[1][6] = local_7238[6];
  batch_point_buffer[1][7] = local_7238[7];
  batch_point_buffer[1][9] = acStack_7230[1];
  batch_point_buffer[1][8] = acStack_7230[0];
  batch_point_buffer[1][10] = acStack_7230[2];
  batch_point_buffer[1][0xb] = acStack_7230[3];
  batch_point_buffer[1][0xc] = acStack_7230[4];
  batch_point_buffer[1][0xd] = acStack_7230[5];
  batch_point_buffer[1][0xe] = acStack_7230[6];
  batch_point_buffer[1][0xf] = acStack_7230[7];
  batch_point_buffer[1][0x11] = local_7228[1];
  batch_point_buffer[1][0x10] = local_7228[0];
  batch_point_buffer[1][0x12] = local_7228[2];
  batch_point_buffer[1][0x13] = local_7228[3];
  batch_point_buffer[1][0x14] = cStack_7224;
  batch_point_buffer[1][0x15] = cStack_7223;
  batch_point_buffer[1][0x16] = cStack_7222;
  batch_point_buffer[1][0x17] = uStack_7221;
  batch_point_buffer[1][0x19] = cStack_721f;
  batch_point_buffer[1][0x18] = cStack_7220;
  batch_point_buffer[1][0x1a] = cStack_721e;
  batch_point_buffer[1][0x1b] = cStack_721d;
  batch_point_buffer[1][0x1c] = cStack_721c;
  batch_point_buffer[1][0x1d] = cStack_721b;
  batch_point_buffer[1][0x1e] = cStack_721a;
  batch_point_buffer[1][0x1f] = uStack_7219;
  if (((local_7258 != 0 || local_7248 != 0) || (local_7250 != 0 || local_7240 != 0)) ||
     (auVar34[0] = -(local_7228[0] == local_7208[0]), auVar34[1] = -(local_7228[1] == local_7208[1])
     , auVar34[2] = -(local_7228[2] == local_7208[2]),
     auVar34[3] = -(local_7228[3] == local_7208[3]), auVar34[4] = -(cStack_7224 == cStack_7204),
     auVar34[5] = -(cStack_7223 == cStack_7203), auVar34[6] = -(cStack_7222 == cStack_7202),
     auVar34[7] = -(uStack_7221 == uStack_7201), auVar34[8] = -(cStack_7220 == cStack_7200),
     auVar34[9] = -(cStack_721f == cStack_71ff), auVar34[10] = -(cStack_721e == cStack_71fe),
     auVar34[0xb] = -(cStack_721d == cStack_71fd), auVar34[0xc] = -(cStack_721c == cStack_71fc),
     auVar34[0xd] = -(cStack_721b == cStack_71fb), auVar34[0xe] = -(cStack_721a == cStack_71fa),
     auVar34[0xf] = -(uStack_7219 == uStack_71f9), auVar33[0] = -(local_7238[0] == local_7218[0]),
     auVar33[1] = -(local_7238[1] == local_7218[1]), auVar33[2] = -(local_7238[2] == local_7218[2]),
     auVar33[3] = -(local_7238[3] == local_7218[3]), auVar33[4] = -(local_7238[4] == local_7218[4]),
     auVar33[5] = -(local_7238[5] == local_7218[5]), auVar33[6] = -(local_7238[6] == local_7218[6]),
     auVar33[7] = -(local_7238[7] == local_7218[7]),
     auVar33[8] = -(acStack_7230[0] == acStack_7210[0]),
     auVar33[9] = -(acStack_7230[1] == acStack_7210[1]),
     auVar33[10] = -(acStack_7230[2] == acStack_7210[2]),
     auVar33[0xb] = -(acStack_7230[3] == acStack_7210[3]),
     auVar33[0xc] = -(acStack_7230[4] == acStack_7210[4]),
     auVar33[0xd] = -(acStack_7230[5] == acStack_7210[5]),
     auVar33[0xe] = -(acStack_7230[6] == acStack_7210[6]),
     auVar33[0xf] = -(acStack_7230[7] == acStack_7210[7]), auVar33 = auVar33 & auVar34,
     (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff)) {
    local_72bc = local_72bc | 2;
LAB_0022316e:
    lVar27 = 0;
    do {
      iVar4 = ed25519_sign_open(m[lVar27],mlen[lVar27],pk[lVar27],local_72b0[lVar27]);
      valid[lVar27] = (uint)(iVar4 == 0);
      local_72bc = local_72bc | iVar4 == 0 ^ 1;
      lVar27 = lVar27 + 1;
    } while (lVar11 != lVar27);
  }
  m = m + uVar26;
  mlen = mlen + uVar26;
  pk = pk + uVar26;
  local_72b0 = local_72b0 + uVar26;
  num = num - uVar26;
  valid = valid + uVar26;
  if (num < 4) goto LAB_00223210;
  goto LAB_00222349;
}

Assistant:

int
ED25519_FN(ed25519_sign_open_batch) (const unsigned char **m, size_t *mlen, const unsigned char **pk, const unsigned char **RS, size_t num, int *valid) {
	batch_heap ALIGN(16) batch;
	ge25519 ALIGN(16) p;
	bignum256modm *r_scalars;
	size_t i, batchsize;
	unsigned char hram[64];
	int ret = 0;

	for (i = 0; i < num; i++)
		valid[i] = 1;

	while (num > 3) {
		batchsize = (num > max_batch_size) ? max_batch_size : num;

		/* generate r (scalars[batchsize+1]..scalars[2*batchsize] */
		ED25519_FN(ed25519_randombytes_unsafe) (batch.r, batchsize * 16);
		r_scalars = &batch.scalars[batchsize + 1];
		for (i = 0; i < batchsize; i++)
			expand256_modm(r_scalars[i], batch.r[i], 16);

		/* compute scalars[0] = ((r1s1 + r2s2 + ...)) */
		for (i = 0; i < batchsize; i++) {
			expand256_modm(batch.scalars[i], RS[i] + 32, 32);
			mul256_modm(batch.scalars[i], batch.scalars[i], r_scalars[i]);
		}
		for (i = 1; i < batchsize; i++)
			add256_modm(batch.scalars[0], batch.scalars[0], batch.scalars[i]);

		/* compute scalars[1]..scalars[batchsize] as r[i]*H(R[i],A[i],m[i]) */
		for (i = 0; i < batchsize; i++) {
			ed25519_hram(hram, RS[i], pk[i], m[i], mlen[i]);
			expand256_modm(batch.scalars[i+1], hram, 64);
			mul256_modm(batch.scalars[i+1], batch.scalars[i+1], r_scalars[i]);
		}

		/* compute points */
		batch.points[0] = ge25519_basepoint;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[i+1], pk[i]))
				goto fallback;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[batchsize+i+1], RS[i]))
				goto fallback;

		ge25519_multi_scalarmult_vartime(&p, &batch, (batchsize * 2) + 1);
		if (!ge25519_is_neutral_vartime(&p)) {
			ret |= 2;

			fallback:
			for (i = 0; i < batchsize; i++) {
				valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
				ret |= (valid[i] ^ 1);
			}
		}

		m += batchsize;
		mlen += batchsize;
		pk += batchsize;
		RS += batchsize;
		num -= batchsize;
		valid += batchsize;
	}

	for (i = 0; i < num; i++) {
		valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
		ret |= (valid[i] ^ 1);
	}

	return ret;
}